

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxMemberIdentifier::Resolve(FxMemberIdentifier *this,FCompileContext *ctx)

{
  FxExpression **object;
  FScriptPosition *this_00;
  PType *pPVar1;
  PClass *pPVar2;
  int iVar3;
  undefined8 in_RAX;
  PStruct *pPVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PSymbol *sym;
  undefined4 extraout_var_01;
  FxExpression *pFVar5;
  PClass *pPVar6;
  PClass *pPVar7;
  undefined4 extraout_var_03;
  PStruct *classctx;
  bool bVar8;
  undefined8 local_38;
  undefined4 extraout_var_02;
  
  if ((this->super_FxIdentifier).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxIdentifier).super_FxExpression.isresolved = true;
  object = &this->Object;
  pFVar5 = this->Object;
  local_38 = in_RAX;
  if (pFVar5->ExprType == EFX_Identifier) {
    local_38 = CONCAT44(*(undefined4 *)&pFVar5[1]._vptr_FxExpression,(int)in_RAX);
    pPVar4 = FindStructType((FName *)((long)&local_38 + 4));
    pFVar5 = *object;
    if (pPVar4 == (PStruct *)0x0) {
      if (pFVar5 == (FxExpression *)0x0) goto LAB_0052f875;
      goto LAB_0052f56c;
    }
    *(undefined1 *)((long)&pFVar5[1]._vptr_FxExpression + 4) = 1;
  }
  else {
LAB_0052f56c:
    pPVar4 = (PStruct *)0x0;
  }
  iVar3 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
  *object = (FxExpression *)CONCAT44(extraout_var,iVar3);
  if ((FxExpression *)CONCAT44(extraout_var,iVar3) != (FxExpression *)0x0) {
    FName::NameManager::FindName(&FName::NameData,"allmap",false);
    pPVar7 = PClass::RegistrationInfo.MyClass;
    if ((pPVar4 != (PStruct *)0x0) && (this->Object->ValueType == &TypeError->super_PType)) {
      pPVar6 = (pPVar4->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
               super_DObject.Class;
      if (pPVar6 == (PClass *)0x0) {
        iVar3 = (**(pPVar4->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                   super_DObject._vptr_DObject)(pPVar4);
        pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar3);
        (pPVar4->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
        Class = pPVar6;
      }
      bVar8 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar7 && bVar8) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar7) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((!bVar8) ||
         (*(char *)((long)&pPVar4[1].super_PNamedType.super_PCompoundType.super_PType.HashNext + 1)
          == '\x01')) {
        local_38 = CONCAT44(local_38._4_4_,(this->super_FxIdentifier).Identifier.Index);
        sym = PSymbolTable::FindSymbol
                        (&(pPVar4->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                         (FName *)&local_38,true);
        pPVar7 = PSymbolConst::RegistrationInfo.MyClass;
        if (sym != (PSymbol *)0x0) {
          pPVar6 = (sym->super_PTypeBase).super_DObject.Class;
          if (pPVar6 == (PClass *)0x0) {
            iVar3 = (**(sym->super_PTypeBase).super_DObject._vptr_DObject)(sym);
            pPVar6 = (PClass *)CONCAT44(extraout_var_01,iVar3);
            (sym->super_PTypeBase).super_DObject.Class = pPVar6;
          }
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar7 && bVar8) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar8 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar7) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          this_00 = &(this->super_FxIdentifier).super_FxExpression.ScriptPosition;
          if (bVar8) {
            FScriptPosition::Message
                      (this_00,8,"Resolving name \'%s.%s\' as constant\n",
                       FName::NameData.NameArray[(pPVar4->super_PNamedType).TypeName.Index].Text,
                       FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
            (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
            pFVar5 = FxConstant::MakeConstant(sym,this_00);
            return pFVar5;
          }
          FScriptPosition::Message
                    (this_00,2,"Unable to access \'%s.%s\' in a static context\n",
                     FName::NameData.NameArray[(pPVar4->super_PNamedType).TypeName.Index].Text,
                     FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
          goto LAB_0052f875;
        }
      }
    }
    pPVar7 = PPointer::RegistrationInfo.MyClass;
    pPVar1 = (*object)->ValueType;
    if (pPVar1 == (PType *)TypeColor) {
      (*object)->ValueType = (PType *)TypeColorStruct;
    }
    else {
      pPVar6 = *(PClass **)(&((PInt *)&pPVar1->super_PTypeBase)->field_0x0 + 8);
      if (pPVar6 == (PClass *)0x0) {
        pPVar6 = (PClass *)(*(code *)**(undefined8 **)&pPVar1->super_PTypeBase)(pPVar1);
        *(PClass **)(&((PInt *)&pPVar1->super_PTypeBase)->field_0x0 + 8) = pPVar6;
      }
      pPVar2 = PStruct::RegistrationInfo.MyClass;
      bVar8 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar7 && bVar8) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar7) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      pPVar1 = (*object)->ValueType;
      if (bVar8) {
        pPVar4 = (PStruct *)pPVar1[1].super_PTypeBase.super_DObject._vptr_DObject;
        pPVar7 = (pPVar4->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                 super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar3 = (**(pPVar4->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                     super_DObject._vptr_DObject)(pPVar4);
          pPVar7 = (PClass *)CONCAT44(extraout_var_02,iVar3);
          (pPVar4->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
          Class = pPVar7;
        }
        bVar8 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar2 && bVar8) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar8 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar2) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (bVar8) {
          classctx = ctx->Class;
LAB_0052f837:
          pFVar5 = FxIdentifier::ResolveMember(&this->super_FxIdentifier,ctx,classctx,object,pPVar4)
          ;
          (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
          return pFVar5;
        }
      }
      else {
        pPVar7 = (pPVar1->super_PTypeBase).super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar3 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
          pPVar7 = (PClass *)CONCAT44(extraout_var_03,iVar3);
          (pPVar1->super_PTypeBase).super_DObject.Class = pPVar7;
        }
        bVar8 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar2 && bVar8) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar8 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar2) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (bVar8) {
          classctx = ctx->Class;
          pPVar4 = (PStruct *)this->Object->ValueType;
          goto LAB_0052f837;
        }
      }
    }
    FScriptPosition::Message
              (&(this->super_FxIdentifier).super_FxExpression.ScriptPosition,2,
               "Left side of %s is not a struct or class",
               FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
  }
LAB_0052f875:
  (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxMemberIdentifier::Resolve(FCompileContext& ctx)
{
	PStruct *ccls = nullptr;
	CHECKRESOLVED();

	if (Object->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Object)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Object)->noglobal = true;
	}

	SAFE_RESOLVE(Object, ctx);

	if (Identifier == FName("allmap"))
	{
		int a = 2;
	}

	// check for class or struct constants if the left side is a type name.
	if (Object->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				PSymbol *sym;
				if ((sym = ccls->Symbols.FindSymbol(Identifier, true)) != nullptr)
				{
					if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
					{
						ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s.%s' as constant\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return FxConstant::MakeConstant(sym, ScriptPosition);
					}
					else
					{
						ScriptPosition.Message(MSG_ERROR, "Unable to access '%s.%s' in a static context\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return nullptr;
					}
				}
			}
		}
	}

	// allow accessing the color channels by mapping the type to a matching struct which defines them.
	if (Object->ValueType == TypeColor)
	{
		Object->ValueType = TypeColorStruct;
	}

	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Object->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(ptype));
			delete this;
			return ret;
		}
	}
	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(Object->ValueType));
		delete this;
		return ret;
	}

	ScriptPosition.Message(MSG_ERROR, "Left side of %s is not a struct or class", Identifier.GetChars());
	delete this;
	return nullptr;
}